

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O1

void simd::AbsoluteDifference
               (Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,uint32_t startX2,
               uint32_t startY2,Image *out,uint32_t startXOut,uint32_t startYOut,uint32_t width,
               uint32_t height,SIMDType simdType)

{
  uint32_t rowSizeIn1;
  uint32_t rowSizeIn2;
  uint32_t rowSizeOut;
  byte bVar1;
  undefined4 in_register_00000014;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  undefined4 in_register_00000034;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  uint8_t *outY;
  ulong uVar2;
  uint uVar3;
  uint32_t totalSimdWidth;
  uint32_t nonSimdWidth;
  uint32_t local_a8;
  uint32_t local_a4;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  uint32_t simdWidth;
  
  local_98 = CONCAT44(in_register_0000008c,startY2);
  local_88 = CONCAT44(in_register_00000084,startX2);
  local_90 = CONCAT44(in_register_00000034,startX1);
  local_a0 = CONCAT44(in_register_00000014,startY1);
  local_a8 = width;
  while( true ) {
    local_a4 = height;
    bVar1 = Image_Function::CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>
                      (in1,in2,out);
    uVar2 = 0;
    if (simdType < 4) {
      uVar2 = (ulong)*(uint *)(&DAT_001ddb20 + (ulong)simdType * 4);
    }
    if (simdType == cpu_function) break;
    if ((uint)uVar2 <= local_a8 * bVar1) {
      Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
                (in1,(uint32_t)local_90,(uint32_t)local_a0,in2,(uint32_t)local_88,(uint32_t)local_98
                 ,out,startXOut,startYOut,local_a8,local_a4);
      local_a8 = local_a8 * bVar1;
      local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00201be8;
      local_58._data = (uchar *)0x0;
      local_58._type = in2->_type;
      PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)in2,src);
      local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00201be8;
      local_80._data = (uchar *)0x0;
      local_80._type = out->_type;
      PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_80,(EVP_PKEY_CTX *)out,src_00);
      Image_Function::
      OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
                (&local_a8,&local_a4,in1,&local_58,&local_80);
      local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00201be8;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
      local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00201be8;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
      rowSizeIn1 = in1->_rowSize;
      rowSizeIn2 = in2->_rowSize;
      rowSizeOut = out->_rowSize;
      uVar3 = (uint)bVar1;
      outY = out->_data + (ulong)(startXOut * uVar3) + (ulong)(startYOut * rowSizeOut);
      simdWidth = (uint32_t)(local_a8 / uVar2);
      totalSimdWidth = simdWidth * (uint)uVar2;
      nonSimdWidth = (uint32_t)((ulong)local_a8 % uVar2);
      if (simdType == sse_function) {
        sse::AbsoluteDifference
                  (rowSizeIn1,rowSizeIn2,rowSizeOut,
                   in1->_data + (ulong)((int)local_90 * uVar3) + (ulong)((int)local_a0 * rowSizeIn1)
                   ,in2->_data +
                    (ulong)((int)local_88 * uVar3) + (ulong)((int)local_98 * rowSizeIn2),outY,
                   outY + local_a4 * rowSizeOut,simdWidth,totalSimdWidth,nonSimdWidth);
        return;
      }
      if (simdType != avx_function) {
        return;
      }
      avx::AbsoluteDifference
                (rowSizeIn1,rowSizeIn2,rowSizeOut,
                 in1->_data + (ulong)((int)local_90 * uVar3) + (ulong)((int)local_a0 * rowSizeIn1),
                 in2->_data + (ulong)((int)local_88 * uVar3) + (ulong)((int)local_98 * rowSizeIn2),
                 outY,outY + local_a4 * rowSizeOut,simdWidth,totalSimdWidth,nonSimdWidth);
      return;
    }
    if (simdType != avx_function) break;
    simdType = sse_function;
    height = local_a4;
  }
  Image_Function::AbsoluteDifference
            (in1,(uint32_t)local_90,(uint32_t)local_a0,in2,(uint32_t)local_88,(uint32_t)local_98,out
             ,startXOut,startYOut,local_a8,local_a4);
  return;
}

Assistant:

void AbsoluteDifference( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                             Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t width, uint32_t height, SIMDType simdType )
    {
        const uint8_t colorCount = Image_Function::CommonColorCount( in1, in2, out );
        const uint32_t simdSize = getSimdSize( simdType );

        if( (simdType == cpu_function) || (width * colorCount < simdSize) ) {
            AVX_CODE( AbsoluteDifference( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height, sse_function ); )

            Image_Function::AbsoluteDifference( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );
            return;
        }

        Image_Function::ParameterValidation( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );
        width = width * colorCount;

        Image_Function::OptimiseRoi( width, height, in1, in2, out );

        const uint32_t rowSizeIn1 = in1.rowSize();
        const uint32_t rowSizeIn2 = in2.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * in1Y = in1.data() + startY1   * rowSizeIn1 + startX1   * colorCount;
        const uint8_t * in2Y = in2.data() + startY2   * rowSizeIn2 + startX2   * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        AVX_CODE( avx::AbsoluteDifference( rowSizeIn1, rowSizeIn2, rowSizeOut, in1Y, in2Y, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
        SSE_CODE( sse::AbsoluteDifference( rowSizeIn1, rowSizeIn2, rowSizeOut, in1Y, in2Y, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
        NEON_CODE( neon::AbsoluteDifference( rowSizeIn1, rowSizeIn2, rowSizeOut, in1Y, in2Y, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
    }